

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int luaH_next(lua_State *L,Table *t,StkId key)

{
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  Node *pNVar4;
  long lVar5;
  uint uVar6;
  Value VVar7;
  ulong uVar8;
  TValue *io;
  int iVar9;
  uint uVar10;
  TKey *t1;
  int iVar11;
  int iVar12;
  int iVar13;
  
  if (key->tt_ == 0x13) {
    VVar7 = key->value_;
    if (((code *)0xffffffff7fffffff < VVar7.f + -0x80000001) &&
       (uVar3 = t->sizearray, (uint)VVar7.b <= uVar3)) goto LAB_00119400;
  }
  else if (key->tt_ == 0) {
    uVar3 = t->sizearray;
    VVar7.gc = (GCObject *)0x0;
    goto LAB_00119400;
  }
  pNVar4 = mainposition(t,key);
  t1 = &pNVar4->i_key;
  iVar9 = luaV_equalobj((lua_State *)0x0,&t1->tvk,key);
  while ((iVar9 == 0 &&
         ((((pNVar4->i_key).nk.tt_ != 10 || ((key->tt_ & 0x40) == 0)) ||
          ((t1->nk).value_.gc != (key->value_).gc))))) {
    lVar5 = (long)(pNVar4->i_key).nk.next;
    if (lVar5 == 0) {
      luaG_runerror(L,"invalid key to \'next\'");
    }
    t1 = &pNVar4[lVar5].i_key;
    iVar9 = luaV_equalobj((lua_State *)0x0,&t1->tvk,key);
    pNVar4 = pNVar4 + lVar5;
  }
  uVar3 = t->sizearray;
  VVar7._0_4_ = uVar3 + (int)((ulong)((long)pNVar4 - (long)t->node) >> 5) + 1;
  VVar7.i._4_4_ = 0;
LAB_00119400:
  uVar6 = VVar7.b;
  iVar9 = uVar3 - uVar6;
  if (uVar6 <= uVar3 && iVar9 != 0) {
    uVar8 = VVar7.i & 0xffffffff;
    lVar5 = uVar8 << 4;
    do {
      uVar8 = uVar8 + 1;
      if (*(int *)((long)&t->array->tt_ + lVar5) != 0) {
        (key->value_).i = uVar8 & 0xffffffff;
        key->tt_ = 0x13;
        piVar1 = (int *)((long)&t->array->value_ + lVar5);
        iVar9 = *piVar1;
        iVar11 = piVar1[1];
        iVar12 = piVar1[2];
        iVar13 = piVar1[3];
        goto LAB_00119481;
      }
      lVar5 = lVar5 + 0x10;
      iVar9 = iVar9 + -1;
      uVar6 = uVar3;
    } while (iVar9 != 0);
  }
  uVar10 = 1 << (t->lsizenode & 0x1f);
  uVar6 = uVar6 - uVar3;
  if ((int)uVar6 < (int)uVar10) {
    pNVar4 = t->node;
    do {
      if (pNVar4[uVar6].i_val.tt_ != 0) {
        uVar2 = *(undefined8 *)((long)&pNVar4[uVar6].i_key + 8);
        key->value_ = pNVar4[uVar6].i_key.nk.value_;
        *(undefined8 *)&key->tt_ = uVar2;
        pNVar4 = t->node + uVar6;
        iVar9 = (pNVar4->i_val).value_.b;
        iVar11 = *(int *)((long)&(pNVar4->i_val).value_ + 4);
        iVar12 = (pNVar4->i_val).tt_;
        iVar13 = *(int *)&(pNVar4->i_val).field_0xc;
LAB_00119481:
        key[1].value_.b = iVar9;
        *(int *)((long)&key[1].value_ + 4) = iVar11;
        key[1].tt_ = iVar12;
        *(int *)&key[1].field_0xc = iVar13;
        return 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  return 0;
}

Assistant:

int luaH_next(lua_State *L, Table *t, StkId key) {
    unsigned int i = findindex(L, t, key);  /* find original element */
    for (; i < t->sizearray; i++) {  /* try first array part */
        if (!ttisnil(&t->array[i])) {  /* a non-nil value? */
            setivalue(key, i + 1);
            setobj2s(L, key + 1, &t->array[i]);
            return 1;
        }
    }
    for (i -= t->sizearray; cast_int(i) < sizenode(t); i++) {  /* hash part */
        if (!ttisnil(gval(gnode(t, i)))) {  /* a non-nil value? */
            setobj2s(L, key, gkey(gnode(t, i)));
            setobj2s(L, key + 1, gval(gnode(t, i)));
            return 1;
        }
    }
    return 0;  /* no more elements */
}